

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLutility.c
# Opt level: O3

void RDL_print2DCharArray(char **arr,uint n,uint m)

{
  ulong uVar1;
  ulong uVar2;
  
  if (n != 0) {
    uVar2 = 0;
    do {
      if (m != 0) {
        uVar1 = 0;
        do {
          printf("%d ",(ulong)(uint)(int)arr[uVar2][uVar1]);
          uVar1 = uVar1 + 1;
        } while (m != uVar1);
      }
      putchar(10);
      uVar2 = uVar2 + 1;
    } while (uVar2 != n);
  }
  return;
}

Assistant:

void RDL_print2DCharArray(char **arr, unsigned n, unsigned m)
{
  unsigned i,j;
  for(i=0; i<n; ++i)
  {
    for(j=0; j<m; ++j)
    {
      printf("%d ",arr[i][j]);
    }
    printf("\n");
  }
}